

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportBuildAndroidMKGenerator.cxx
# Opt level: O2

void __thiscall
cmExportBuildAndroidMKGenerator::GenerateImportTargetCode
          (cmExportBuildAndroidMKGenerator *this,ostream *os,cmGeneratorTarget *target,
          TargetType param_3)

{
  ostream *poVar1;
  string noConfig;
  string path;
  string targetName;
  string local_a0;
  string local_80;
  string local_60;
  string local_40;
  
  cmGeneratorTarget::GetExportName_abi_cxx11_(&local_a0,target);
  cmStrCat<std::__cxx11::string&,std::__cxx11::string>
            (&local_40,
             &(this->super_cmExportBuildFileGenerator).super_cmExportFileGenerator.Namespace,
             &local_a0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::operator<<(os,"include $(CLEAR_VARS)\n");
  std::operator<<(os,"LOCAL_MODULE := ");
  poVar1 = std::operator<<(os,(string *)&local_40);
  std::operator<<(poVar1,"\n");
  std::operator<<(os,"LOCAL_SRC_FILES := ");
  local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
  local_a0._M_string_length = 0;
  local_a0.field_2._M_local_buf[0] = '\0';
  cmGeneratorTarget::GetFullPath(&local_80,target,&local_a0,RuntimeBinaryArtifact,false);
  cmSystemTools::ConvertToOutputPath(&local_60,&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  poVar1 = std::operator<<(os,(string *)&local_60);
  std::operator<<(poVar1,"\n");
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

void cmExportBuildAndroidMKGenerator::GenerateImportTargetCode(
  std::ostream& os, cmGeneratorTarget const* target,
  cmStateEnums::TargetType /*targetType*/)
{
  std::string targetName = cmStrCat(this->Namespace, target->GetExportName());
  os << "include $(CLEAR_VARS)\n";
  os << "LOCAL_MODULE := ";
  os << targetName << "\n";
  os << "LOCAL_SRC_FILES := ";
  std::string const noConfig; // FIXME: What config to use here?
  std::string path =
    cmSystemTools::ConvertToOutputPath(target->GetFullPath(noConfig));
  os << path << "\n";
}